

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerPointers.h
# Opt level: O3

WriteBarrierPtr<Memory::WriteBarrierPtr<void>_> __thiscall
Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::operator++
          (WriteBarrierPtr<Memory::WriteBarrierPtr<void>_> *this,int param_1)

{
  WriteBarrierPtr<void> *pWVar1;
  long *addr;
  undefined4 in_register_00000034;
  
  addr = (long *)CONCAT44(in_register_00000034,param_1);
  pWVar1 = *(WriteBarrierPtr<void> **)CONCAT44(in_register_00000034,param_1);
  Recycler::WBSetBit((char *)this);
  this->ptr = pWVar1;
  RecyclerWriteBarrierManager::WriteBarrier(this);
  Recycler::WBSetBit((char *)addr);
  *addr = *addr + 8;
  RecyclerWriteBarrierManager::WriteBarrier(addr);
  return (WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>)(WriteBarrierPtr<void> *)this;
}

Assistant:

WriteBarrierPtr operator++(int)  // postfix ++
    {
        WriteBarrierPtr result(*this);
        ++(*this);
        return result;
    }